

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

PyObject * libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)

{
  int *piVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr pxVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _xmlNode **pp_Var6;
  undefined8 uVar7;
  PyObject *pPVar8;
  long lVar9;
  PyObject *pPVar10;
  long lVar11;
  bool bVar12;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    return (PyObject *)&_Py_NoneStruct;
  }
  switch(obj->type) {
  case XPATH_NODESET:
    if ((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) {
      pPVar10 = (PyObject *)PyList_New(0);
    }
    else {
      pPVar10 = (PyObject *)PyList_New();
      for (lVar11 = 0; lVar11 < obj->nodesetval->nodeNr; lVar11 = lVar11 + 1) {
        pxVar3 = obj->nodesetval->nodeTab[lVar11];
        if (pxVar3->type == XML_NAMESPACE_DECL) {
          uVar4 = PyCapsule_New(pxVar3,"xmlNsPtr",libxml_xmlXPathDestructNsNode);
          PyList_SetItem(pPVar10,lVar11,uVar4);
          obj->nodesetval->nodeTab[lVar11] = (xmlNodePtr)0x0;
        }
        else {
          pPVar8 = libxml_xmlNodePtrWrap(pxVar3);
          PyList_SetItem(pPVar10,lVar11,pPVar8);
        }
      }
    }
    break;
  case XPATH_BOOLEAN:
    pPVar10 = (PyObject *)PyLong_FromLong((long)obj->boolval);
    break;
  case XPATH_NUMBER:
    pPVar10 = (PyObject *)PyFloat_FromDouble(obj->floatval);
    break;
  case XPATH_STRING:
    pPVar10 = (PyObject *)PyUnicode_FromString(obj->stringval);
    break;
  case XPATH_POINT:
    pPVar8 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user);
    uVar4 = PyLong_FromLong((long)obj->index);
    pPVar10 = (PyObject *)PyTuple_New(2);
    PyTuple_SetItem(pPVar10,0,pPVar8);
    PyTuple_SetItem(pPVar10,1,uVar4);
    break;
  case XPATH_RANGE:
    if ((obj->user2 == (void *)0x0) || ((obj->user2 == obj->user && (obj->index == obj->index2)))) {
      pPVar10 = (PyObject *)PyList_New(1);
      pPVar8 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user);
      uVar4 = PyLong_FromLong((long)obj->index);
      uVar5 = PyTuple_New(2);
      PyTuple_SetItem(uVar5,0,pPVar8);
      PyTuple_SetItem(uVar5,1,uVar4);
      uVar4 = 0;
    }
    else {
      pPVar10 = (PyObject *)PyList_New(2);
      pPVar8 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user);
      uVar5 = PyLong_FromLong((long)obj->index);
      uVar7 = PyTuple_New(2);
      PyTuple_SetItem(uVar7,0,pPVar8);
      uVar4 = 1;
      PyTuple_SetItem(uVar7,1,uVar5);
      PyList_SetItem(pPVar10,0,uVar7);
      pPVar8 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user2);
      uVar7 = PyLong_FromLong((long)obj->index2);
      uVar5 = PyTuple_New(2);
      PyTuple_SetItem(uVar5,0,pPVar8);
      PyTuple_SetItem(uVar5,1,uVar7);
    }
    PyList_SetItem(pPVar10,uVar4,uVar5);
    break;
  case XPATH_LOCATIONSET:
    piVar1 = (int *)obj->user;
    if ((piVar1 != (int *)0x0) && (0 < *piVar1)) {
      pPVar10 = (PyObject *)PyList_New();
      for (lVar11 = 0; lVar11 < *piVar1; lVar11 = lVar11 + 1) {
        pPVar8 = libxml_xmlXPathObjectPtrWrap
                           (*(xmlXPathObjectPtr *)(*(long *)(piVar1 + 2) + lVar11 * 8));
        *(undefined8 *)(*(long *)(piVar1 + 2) + lVar11 * 8) = 0;
        PyList_SetItem(pPVar10,lVar11,pPVar8);
      }
      *piVar1 = 0;
      break;
    }
  default:
    pPVar10 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    break;
  case XPATH_XSLT_TREE:
    pxVar2 = obj->nodesetval;
    if (((pxVar2 != (xmlNodeSetPtr)0x0) && (pxVar2->nodeNr != 0)) &&
       (pxVar2->nodeTab != (xmlNodePtr *)0x0)) {
      lVar11 = 0;
      for (pp_Var6 = &(*pxVar2->nodeTab)->children; *pp_Var6 != (_xmlNode *)0x0;
          pp_Var6 = &(*pp_Var6)->next) {
        lVar11 = lVar11 + 1;
      }
      pPVar10 = (PyObject *)PyList_New(lVar11);
      pp_Var6 = &(*obj->nodesetval->nodeTab)->children;
      lVar9 = 0;
      while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
        pxVar3 = *pp_Var6;
        pPVar8 = libxml_xmlNodePtrWrap(pxVar3);
        PyList_SetItem(pPVar10,lVar9,pPVar8);
        pp_Var6 = &pxVar3->next;
        lVar9 = lVar9 + 1;
      }
      return pPVar10;
    }
    pPVar10 = (PyObject *)PyList_New(0);
    return pPVar10;
  }
  xmlXPathFreeObject(obj);
  return pPVar10;
}

Assistant:

PyObject *
libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlXPathObjectPtrWrap: ctxt = %p\n", obj);
#endif
    if (obj == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    switch (obj->type) {
        case XPATH_XSLT_TREE: {
            if ((obj->nodesetval == NULL) ||
		(obj->nodesetval->nodeNr == 0) ||
		(obj->nodesetval->nodeTab == NULL)) {
                ret = PyList_New(0);
	    } else {
		int i, len = 0;
		xmlNodePtr node;

		node = obj->nodesetval->nodeTab[0]->children;
		while (node != NULL) {
		    len++;
		    node = node->next;
		}
		ret = PyList_New(len);
		node = obj->nodesetval->nodeTab[0]->children;
		for (i = 0;i < len;i++) {
                    PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    node = node->next;
		}
	    }
	    /*
	     * Return now, do not free the object passed down
	     */
	    return (ret);
	}
        case XPATH_NODESET:
            if ((obj->nodesetval == NULL)
                || (obj->nodesetval->nodeNr == 0)) {
                ret = PyList_New(0);
	    } else {
                int i;
                xmlNodePtr node;

                ret = PyList_New(obj->nodesetval->nodeNr);
                for (i = 0; i < obj->nodesetval->nodeNr; i++) {
                    node = obj->nodesetval->nodeTab[i];
                    if (node->type == XML_NAMESPACE_DECL) {
		        PyObject *ns = PyCapsule_New((void *) node,
                                     (char *) "xmlNsPtr",
				     libxml_xmlXPathDestructNsNode);
			PyList_SetItem(ret, i, ns);
			/* make sure the xmlNsPtr is not destroyed now */
			obj->nodesetval->nodeTab[i] = NULL;
		    } else {
			PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    }
                }
            }
            break;
        case XPATH_BOOLEAN:
            ret = PY_IMPORT_INT((long) obj->boolval);
            break;
        case XPATH_NUMBER:
            ret = PyFloat_FromDouble(obj->floatval);
            break;
        case XPATH_STRING:
	    ret = PY_IMPORT_STRING((char *) obj->stringval);
            break;
        case XPATH_POINT:
        {
            PyObject *node;
            PyObject *indexIntoNode;
            PyObject *tuple;

            node = libxml_xmlNodePtrWrap(obj->user);
            indexIntoNode = PY_IMPORT_INT((long) obj->index);

            tuple = PyTuple_New(2);
            PyTuple_SetItem(tuple, 0, node);
            PyTuple_SetItem(tuple, 1, indexIntoNode);

            ret = tuple;
            break;
        }
        case XPATH_RANGE:
        {
            unsigned short bCollapsedRange;

            bCollapsedRange = ( (obj->user2 == NULL) ||
		                ((obj->user2 == obj->user) && (obj->index == obj->index2)) );
            if ( bCollapsedRange ) {
                PyObject *node;
                PyObject *indexIntoNode;
                PyObject *tuple;
                PyObject *list;

                list = PyList_New(1);

                node = libxml_xmlNodePtrWrap(obj->user);
                indexIntoNode = PY_IMPORT_INT((long) obj->index);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 0, tuple);

                ret = list;
            } else {
                PyObject *node;
                PyObject *indexIntoNode;
                PyObject *tuple;
                PyObject *list;

                list = PyList_New(2);

                node = libxml_xmlNodePtrWrap(obj->user);
                indexIntoNode = PY_IMPORT_INT((long) obj->index);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 0, tuple);

                node = libxml_xmlNodePtrWrap(obj->user2);
                indexIntoNode = PY_IMPORT_INT((long) obj->index2);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 1, tuple);

                ret = list;
            }
            break;
        }
        case XPATH_LOCATIONSET:
        {
            xmlLocationSetPtr set;

            set = obj->user;
            if ( set && set->locNr > 0 ) {
                int i;
                PyObject *list;

                list = PyList_New(set->locNr);

                for (i=0; i<set->locNr; i++) {
                    xmlXPathObjectPtr setobj;
                    PyObject *pyobj;

                    setobj = set->locTab[i]; /*xmlXPathObjectPtr setobj*/

                    pyobj = libxml_xmlXPathObjectPtrWrap(setobj);
                    /* xmlXPathFreeObject(setobj) is called */
                    set->locTab[i] = NULL;

                    PyList_SetItem(list, i, pyobj);
                }
                set->locNr = 0;
                ret = list;
            } else {
                Py_INCREF(Py_None);
                ret = Py_None;
            }
            break;
        }
        default:
#ifdef DEBUG
            printf("Unable to convert XPath object type %d\n", obj->type);
#endif
            Py_INCREF(Py_None);
            ret = Py_None;
    }
    xmlXPathFreeObject(obj);
    return (ret);
}